

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# include.hpp
# Opt level: O3

uchar RC(uchar c)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,c);
  if (iVar1 < 0x61) {
    if (iVar1 < 0x47) {
      if (iVar1 == 0x41) {
        return 'T';
      }
      if (iVar1 != 0x43) {
        return 'N';
      }
      return 'G';
    }
    if (iVar1 == 0x47) {
      return 'C';
    }
    if (iVar1 != 0x54) {
      return 'N';
    }
  }
  else {
    if (iVar1 < 0x67) {
      if (iVar1 == 0x61) {
        return 'T';
      }
      if (iVar1 != 99) {
        return 'N';
      }
      return 'G';
    }
    if (iVar1 == 0x67) {
      return 'C';
    }
    if (iVar1 != 0x74) {
      return 'N';
    }
  }
  return 'A';
}

Assistant:

unsigned char RC(unsigned char c){

	switch(c){

		case 'A': case 'a': return 'T'; break;
		case 'C': case 'c': return 'G'; break;
		case 'G': case 'g': return 'C'; break;
		case 'T': case 't': return 'A'; break;
		default: break;

	}

	return 'N';

}